

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_query.c
# Opt level: O2

int dwarf_die_CU_offset_range
              (Dwarf_Die die,Dwarf_Off *cu_off,Dwarf_Off *cu_length,Dwarf_Error *error)

{
  Dwarf_CU_Context_conflict pDVar1;
  Dwarf_Signed DStack_10;
  
  if (die == (Dwarf_Die)0x0) {
    DStack_10 = 0x34;
  }
  else {
    pDVar1 = die->di_cu_context;
    if (pDVar1 != (Dwarf_CU_Context_conflict)0x0) {
      if ((pDVar1->cc_dbg != (Dwarf_Debug)0x0) && (pDVar1->cc_dbg->de_magic == 0xebfdebfd)) {
        *cu_off = pDVar1->cc_debug_offset;
        *cu_length = (ulong)pDVar1->cc_extension_size +
                     (ulong)pDVar1->cc_length_size + pDVar1->cc_length;
        return 0;
      }
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                          "DW_DLE_DBG_NULL: accesing a cu context, Dwarf_Debug either null or it containsa stale Dwarf_Debug pointer"
                         );
      return 1;
    }
    DStack_10 = 0x68;
  }
  _dwarf_error((Dwarf_Debug)0x0,error,DStack_10);
  return 1;
}

Assistant:

int
dwarf_die_CU_offset_range(Dwarf_Die die,
    Dwarf_Off   *cu_off,
    Dwarf_Off   *cu_length,
    Dwarf_Error *error)
{
    Dwarf_CU_Context cu_context = 0;

    CHECK_DIE(die, DW_DLV_ERROR);
    cu_context = die->di_cu_context;

    *cu_off = cu_context->cc_debug_offset;
    *cu_length = cu_context->cc_length + cu_context->cc_length_size
        + cu_context->cc_extension_size;
    return DW_DLV_OK;
}